

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::interval_t,duckdb::date_t,duckdb::date_t,duckdb::BinaryLambdaWrapper,bool,duckdb::date_t(*)(duckdb::interval_t,duckdb::date_t),false,true>
               (interval_t *ldata,date_t *rdata,date_t *result_data,idx_t count,ValidityMask *mask,
               _func_date_t_interval_t_date_t *fun)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  unsigned_long *puVar4;
  ulong uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  date_t dVar9;
  date_t dVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  int64_t *piVar14;
  ulong uVar15;
  idx_t iVar16;
  ulong uVar17;
  interval_t iVar18;
  interval_t iVar19;
  interval_t iVar20;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      dVar9 = (date_t)rdata->days;
      piVar14 = &ldata->micros;
      iVar16 = 0;
      do {
        uVar3 = ((interval_t *)(piVar14 + -1))->months;
        uVar8 = ((interval_t *)(piVar14 + -1))->days;
        iVar20.days = uVar8;
        iVar20.months = uVar3;
        iVar20.micros = *piVar14;
        dVar10 = (*fun)(iVar20,dVar9);
        result_data[iVar16].days = dVar10.days;
        iVar16 = iVar16 + 1;
        piVar14 = piVar14 + 2;
      } while (count != iVar16);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar11 = 0;
    uVar15 = 0;
    do {
      puVar4 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar4 == (unsigned_long *)0x0) {
        uVar12 = uVar15 + 0x40;
        if (count <= uVar15 + 0x40) {
          uVar12 = count;
        }
LAB_00623dae:
        uVar13 = uVar15;
        if (uVar15 < uVar12) {
          dVar9 = (date_t)rdata->days;
          piVar14 = &ldata[uVar15].micros;
          do {
            uVar2 = ((interval_t *)(piVar14 + -1))->months;
            uVar7 = ((interval_t *)(piVar14 + -1))->days;
            iVar19.days = uVar7;
            iVar19.months = uVar2;
            iVar19.micros = *piVar14;
            dVar10 = (*fun)(iVar19,dVar9);
            result_data[uVar15].days = dVar10.days;
            uVar15 = uVar15 + 1;
            piVar14 = piVar14 + 2;
            uVar13 = uVar12;
          } while (uVar12 != uVar15);
        }
      }
      else {
        uVar5 = puVar4[uVar11];
        uVar12 = uVar15 + 0x40;
        if (count <= uVar15 + 0x40) {
          uVar12 = count;
        }
        uVar13 = uVar12;
        if (uVar5 != 0) {
          if (uVar5 == 0xffffffffffffffff) goto LAB_00623dae;
          uVar13 = uVar15;
          if (uVar15 < uVar12) {
            piVar14 = &ldata[uVar15].micros;
            uVar17 = 0;
            do {
              if ((uVar5 >> (uVar17 & 0x3f) & 1) != 0) {
                uVar1 = ((interval_t *)(piVar14 + -1))->months;
                uVar6 = ((interval_t *)(piVar14 + -1))->days;
                iVar18.days = uVar6;
                iVar18.months = uVar1;
                iVar18.micros = *piVar14;
                dVar9 = (*fun)(iVar18,rdata->days);
                result_data[uVar15 + uVar17].days = dVar9.days;
              }
              uVar17 = uVar17 + 1;
              piVar14 = piVar14 + 2;
              uVar13 = uVar12;
            } while (uVar12 - uVar15 != uVar17);
          }
        }
      }
      uVar11 = uVar11 + 1;
      uVar15 = uVar13;
    } while (uVar11 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}